

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  string dirs;
  allocator local_cb;
  allocator local_ca;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (((INTERFACE_LIBRARY < this->TargetTypeValue) ||
      ((0x8eU >> (this->TargetTypeValue & 0x1f) & 1) == 0)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return;
  }
  if (this->BuildInterfaceIncludesAppended == false) {
    this->BuildInterfaceIncludesAppended = true;
    this_00 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&local_a8,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE",(allocator *)&local_c8);
    bVar1 = cmMakefile::IsOn(this_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      pcVar2 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      pcVar3 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
      pcVar4 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        pcVar4 = "";
      }
      std::__cxx11::string::string((string *)&local_68,pcVar4,&local_c9);
      pcVar4 = ";";
      if (pcVar2 == (char *)0x0) {
        pcVar4 = "";
      }
      std::__cxx11::string::string((string *)&local_88,pcVar4,&local_ca);
      std::operator+(&local_c8,&local_68,&local_88);
      pcVar4 = "";
      if (pcVar3 != (char *)0x0) {
        pcVar4 = pcVar3;
      }
      std::__cxx11::string::string((string *)&local_48,pcVar4,&local_cb);
      std::operator+(&local_a8,&local_c8,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      if (local_a8._M_string_length != 0) {
        std::__cxx11::string::string
                  ((string *)&local_c8,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&local_48);
        std::operator+(&local_88,"$<BUILD_INTERFACE:",&local_a8);
        std::operator+(&local_68,&local_88,">");
        AppendProperty(this,&local_c8,local_68._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if(this->GetType() != cmState::SHARED_LIBRARY &&
     this->GetType() != cmState::STATIC_LIBRARY &&
     this->GetType() != cmState::MODULE_LIBRARY &&
     this->GetType() != cmState::INTERFACE_LIBRARY &&
     !this->IsExecutableWithExports())
    {
    return;
    }
  if (this->BuildInterfaceIncludesAppended)
    {
    return;
    }
  this->BuildInterfaceIncludesAppended = true;

  if (this->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE"))
    {
    const char *binDir = this->Makefile->GetCurrentBinaryDirectory();
    const char *srcDir = this->Makefile->GetCurrentSourceDirectory();
    const std::string dirs = std::string(binDir ? binDir : "")
                            + std::string(binDir ? ";" : "")
                            + std::string(srcDir ? srcDir : "");
    if (!dirs.empty())
      {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                            ("$<BUILD_INTERFACE:" + dirs + ">").c_str());
      }
    }
}